

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMatching.cpp
# Opt level: O0

bool is_no_ll_fpr_store(Instruction *instr,MatchParam<Register> src,MatchParam<int> offset,
                       MatchParam<Register> dest)

{
  bool bVar1;
  Register RVar2;
  undefined4 in_ECX;
  int in_EDX;
  Register *in_RDI;
  uint5 in_stack_ffffffffffffffd8;
  bool bVar3;
  undefined2 in_stack_ffffffffffffffde;
  int in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  
  bVar3 = false;
  if (*(int *)in_RDI == 0xe) {
    RVar2 = InstructionAtom::get_reg
                      ((InstructionAtom *)
                       CONCAT26(in_stack_ffffffffffffffde,(uint6)in_stack_ffffffffffffffd8));
    bVar1 = MatchParam<Register>::operator==((MatchParam<Register> *)CONCAT44(in_EDX,in_ECX),in_RDI)
    ;
    bVar3 = false;
    if (bVar1) {
      InstructionAtom::get_imm
                ((InstructionAtom *)
                 CONCAT26(RVar2.id,CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
      bVar1 = MatchParam<int>::operator==
                        ((MatchParam<int> *)&stack0xfffffffffffffff4,(int *)&stack0xffffffffffffffe0
                        );
      bVar3 = false;
      if (bVar1) {
        InstructionAtom::get_reg
                  ((InstructionAtom *)
                   CONCAT26(in_stack_ffffffffffffffde,(uint6)in_stack_ffffffffffffffd8));
        bVar3 = MatchParam<Register>::operator==
                          ((MatchParam<Register> *)CONCAT44(in_EDX,in_ECX),in_RDI);
      }
    }
  }
  return bVar3;
}

Assistant:

bool is_no_ll_fpr_store(const Instruction& instr,
                        MatchParam<Register> src,
                        MatchParam<int> offset,
                        MatchParam<Register> dest) {
  return instr.kind == InstructionKind::SWC1 && src == instr.src[0].get_reg() &&
         offset == instr.src[1].get_imm() && dest == instr.src[2].get_reg();
}